

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O0

int __thiscall
QTlsPrivate::TlsCryptographOpenSSL::init(TlsCryptographOpenSSL *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  QSslSocketPrivate *in_RDX;
  
  this->q = (QSslSocket *)ctx;
  this->d = in_RDX;
  QList<QOcspResponse>::clear((QList<QOcspResponse> *)this);
  QByteArray::clear();
  this->systemOrSslErrorDetected = false;
  this->handshakeInterrupted = false;
  this->fetchAuthorityInformation = false;
  std::optional<QSslCertificate>::reset((optional<QSslCertificate> *)0x1508e3);
  return extraout_EAX;
}

Assistant:

void TlsCryptographOpenSSL::init(QSslSocket *qObj, QSslSocketPrivate *dObj)
{
    Q_ASSERT(qObj);
    Q_ASSERT(dObj);
    q = qObj;
    d = dObj;

    ocspResponses.clear();
    ocspResponseDer.clear();

    systemOrSslErrorDetected = false;
    handshakeInterrupted = false;

    fetchAuthorityInformation = false;
    caToFetch.reset();
}